

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_u8.c
# Opt level: O0

int image_u8_write_pnm(image_u8_t *im,char *path)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  int local_28;
  int local_24;
  int y;
  int res;
  FILE *f;
  char *path_local;
  image_u8_t *im_local;
  
  __stream = fopen(path,"wb");
  local_24 = 0;
  if (__stream == (FILE *)0x0) {
    local_24 = -1;
  }
  else {
    fprintf(__stream,"P5\n%d %d\n255\n",(ulong)(uint)im->width,(ulong)(uint)im->height);
    for (local_28 = 0; local_28 < im->height; local_28 = local_28 + 1) {
      iVar1 = im->width;
      sVar2 = fwrite(im->buf + local_28 * im->stride,1,(long)im->width,__stream);
      if ((long)iVar1 != sVar2) {
        local_24 = -2;
        break;
      }
    }
  }
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  return local_24;
}

Assistant:

int image_u8_write_pnm(const image_u8_t *im, const char *path)
{
    FILE *f = fopen(path, "wb");
    int res = 0;

    if (f == NULL) {
        res = -1;
        goto finish;
    }

    // Only outputs to grayscale
    fprintf(f, "P5\n%d %d\n255\n", im->width, im->height);

    for (int y = 0; y < im->height; y++) {
        if (im->width != fwrite(&im->buf[y*im->stride], 1, im->width, f)) {
            res = -2;
            goto finish;
        }
    }

  finish:
    if (f != NULL)
        fclose(f);

    return res;
}